

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int cmCTest::HTTPRequest
              (string *url,HTTPMethod method,string *response,string *fields,string *putFile,
              int timeout)

{
  FILE *pFVar1;
  bool bVar2;
  CURLcode CVar3;
  char *filename;
  ulong uVar4;
  undefined8 uVar5;
  undefined1 local_c0 [4];
  CURLcode res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  FILE *local_50;
  FILE *file;
  CURL *curl;
  string *psStack_38;
  int timeout_local;
  string *putFile_local;
  string *fields_local;
  string *response_local;
  string *psStack_18;
  HTTPMethod method_local;
  string *url_local;
  
  curl._4_4_ = timeout;
  psStack_38 = putFile;
  putFile_local = fields;
  fields_local = response;
  response_local._4_4_ = method;
  psStack_18 = url;
  curl_global_init(3);
  file = (FILE *)curl_easy_init();
  cmCurlSetCAInfo_abi_cxx11_(&local_70,file,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_70);
  if (response_local._4_4_ != HTTP_GET) {
    if (response_local._4_4_ == HTTP_POST) {
      curl_easy_setopt(file,CURLOPT_POST,1);
      pFVar1 = file;
      uVar5 = std::__cxx11::string::c_str();
      curl_easy_setopt(pFVar1,CURLOPT_POSTFIELDS,uVar5);
      goto LAB_004a93f4;
    }
    if (response_local._4_4_ != HTTP_PUT) goto LAB_004a93f4;
    filename = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileExists(filename);
    if (!bVar2) {
      std::__cxx11::string::operator=((string *)fields_local,"Error: File ");
      std::operator+(&local_90,putFile," does not exist.\n");
      std::__cxx11::string::operator+=((string *)fields_local,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      return -1;
    }
    curl_easy_setopt(file,CURLOPT_PUT,1);
    local_50 = cmsys::SystemTools::Fopen(putFile,"rb");
    curl_easy_setopt(file,CURLOPT_READDATA,local_50);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,"?"
                   ,fields);
    std::__cxx11::string::operator+=((string *)url,(string *)local_c0);
    std::__cxx11::string::~string((string *)local_c0);
  }
LAB_004a93f4:
  pFVar1 = file;
  uVar5 = std::__cxx11::string::c_str();
  curl_easy_setopt(pFVar1,CURLOPT_URL,uVar5);
  curl_easy_setopt(file,CURLOPT_TIMEOUT,(ulong)curl._4_4_);
  curl_easy_setopt(file,CURLOPT_FOLLOWLOCATION,1);
  curl_easy_setopt(file,CURLOPT_WRITEFUNCTION,HTTPResponseCallback);
  curl_easy_setopt(file,CURLOPT_WRITEDATA,fields_local);
  curl_easy_setopt(file,CURLOPT_FAILONERROR,1);
  CVar3 = curl_easy_perform(file);
  curl_easy_cleanup(file);
  curl_global_cleanup();
  return CVar3;
}

Assistant:

int cmCTest::HTTPRequest(std::string url, HTTPMethod method,
                                       std::string& response,
                                       std::string fields,
                                       std::string putFile, int timeout)
{
  CURL* curl;
  FILE* file;
  ::curl_global_init(CURL_GLOBAL_ALL);
  curl = ::curl_easy_init();
  cmCurlSetCAInfo(curl);

  //set request options based on method
  switch(method)
    {
    case cmCTest::HTTP_POST:
      ::curl_easy_setopt(curl, CURLOPT_POST, 1);
      ::curl_easy_setopt(curl, CURLOPT_POSTFIELDS, fields.c_str());
      break;
    case cmCTest::HTTP_PUT:
      if(!cmSystemTools::FileExists(putFile.c_str()))
        {
        response = "Error: File ";
        response += putFile + " does not exist.\n";
        return -1;
        }
      ::curl_easy_setopt(curl, CURLOPT_PUT, 1);
      file = cmsys::SystemTools::Fopen(putFile, "rb");
      ::curl_easy_setopt(curl, CURLOPT_INFILE, file);
      //fall through to append GET fields
    case cmCTest::HTTP_GET:
      if(!fields.empty())
        {
        url += "?" + fields;
        }
      break;
    }

  ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
  ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1);

  //set response options
  ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, HTTPResponseCallback);
  ::curl_easy_setopt(curl, CURLOPT_FILE, (void *)&response);
  ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);

  CURLcode res = ::curl_easy_perform(curl);

  ::curl_easy_cleanup(curl);
  ::curl_global_cleanup();

  return static_cast<int>(res);
}